

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O3

int fits_img_decompress(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  char cVar1;
  undefined1 auVar2 [8];
  void *array;
  int iVar3;
  long lVar4;
  long lVar5;
  size_t __size;
  long lVar6;
  long lVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  FITSfile *pFVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int local_39c;
  double *local_398;
  uint local_390;
  float fnulval;
  undefined1 local_380 [8];
  double dnulval;
  int local_36c;
  int local_368;
  int local_364;
  int local_360;
  int local_35c;
  int local_358;
  int local_354;
  int local_350;
  int local_34c;
  int local_348;
  int local_344;
  long local_340;
  long local_338;
  long local_330;
  long local_328;
  fitsfile *local_320;
  void *local_318;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  fitsfile *local_200;
  long local_1f8;
  long local_1f0;
  long ltile [6];
  long ftile [6];
  long tilesize [6];
  long naxis [6];
  long rowdim [6];
  long tlpixel [6];
  long tfpixel [6];
  LONGLONG fpixel [6];
  LONGLONG lpixel [6];
  
  iVar3 = fits_img_decompress_header(infptr,outfptr,status);
  if (0 < iVar3) goto LAB_001cdb8d;
  pdVar8 = (double *)((long)&fnulval + 1);
  local_398 = (double *)((long)&fnulval + 3);
  pdVar9 = (double *)(local_380 + 3);
  ffrdef(outfptr,status);
  ffpscl(outfptr,1.0,0.0,status);
  ffpscl(infptr,1.0,0.0,status);
  pFVar12 = infptr->Fptr;
  iVar3 = pFVar12->zbitpix;
  local_380 = (undefined1  [8])&fnulval;
  if (iVar3 < 8) {
    if (iVar3 == -0x40) {
      pdVar8 = (double *)((long)&dnulval + 1);
      local_398 = (double *)((long)&dnulval + 3);
      pdVar9 = (double *)((long)&dnulval + 7);
      dnulval = -9.1191291391491e-36;
      local_380 = (undefined1  [8])&dnulval;
      local_39c = 1;
      local_390 = 0x52;
    }
    else if (iVar3 == -0x20) {
      fnulval = -9.11912e-36;
      local_39c = 1;
      local_390 = 0x2a;
    }
    else {
LAB_001cdc06:
      local_390 = 0;
      local_39c = 0;
    }
  }
  else {
    local_39c = 0;
    if (iVar3 == 8) {
      local_390 = 0xb;
    }
    else if (iVar3 == 0x20) {
      local_390 = 0x1f;
    }
    else {
      if (iVar3 != 0x10) goto LAB_001cdc06;
      local_390 = 0x15;
    }
  }
  iVar3 = pFVar12->zndim;
  lVar10 = (long)iVar3;
  if (0 < lVar10) {
    memcpy(lpixel,pFVar12->znaxis,lVar10 * 8);
    lVar10 = lVar10 + -1;
    auVar13._8_4_ = (int)lVar10;
    auVar13._0_8_ = lVar10;
    auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
    lVar10 = 0;
    auVar13 = auVar13 ^ _DAT_0020b9d0;
    auVar14 = _DAT_0020b9c0;
    do {
      auVar15 = auVar14 ^ _DAT_0020b9d0;
      if ((bool)(~(auVar15._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar15._0_4_ ||
                  auVar13._4_4_ < auVar15._4_4_) & 1)) {
        *(undefined8 *)((long)fpixel + lVar10) = 1;
      }
      if ((auVar15._12_4_ != auVar13._12_4_ || auVar15._8_4_ <= auVar13._8_4_) &&
          auVar15._12_4_ <= auVar13._12_4_) {
        *(undefined8 *)((long)fpixel + lVar10 + 8) = 1;
      }
      lVar7 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 2;
      auVar14._8_8_ = lVar7 + 2;
      lVar10 = lVar10 + 0x10;
    } while ((ulong)(iVar3 + 1U >> 1) << 4 != lVar10);
  }
  if (0 < *status) goto LAB_001cdb8d;
  iVar3 = fits_is_compressed_image(infptr,status);
  auVar2 = local_380;
  if (iVar3 == 0) {
    ffpmsg("CHDU is not a compressed image (fits_read_compressed_img)");
    *status = 0x19e;
    goto LAB_001cdb8d;
  }
  local_320 = outfptr;
  if (local_390 < 0x28) {
    if (local_390 < 0x1e) {
      if ((local_390 != 0x14) && (local_390 != 0x15)) goto LAB_001cdce5;
      pFVar12 = infptr->Fptr;
      local_318 = malloc(pFVar12->maxtilelen * 2);
      cVar1 = *(char *)auVar2;
      local_398 = pdVar8;
joined_r0x001ce4d1:
      if (cVar1 != '\0') goto LAB_001cdd1e;
      goto LAB_001cdd0c;
    }
    if ((local_390 != 0x1e) && (local_390 != 0x1f)) goto LAB_001cdce5;
LAB_001cdcb6:
    pFVar12 = infptr->Fptr;
    __size = pFVar12->maxtilelen << 2;
LAB_001cdcc5:
    local_318 = malloc(__size);
    if (((*(char *)auVar2 == '\0') && (*(char *)((long)auVar2 + 1) == '\0')) &&
       (*(char *)((long)auVar2 + 2) == '\0')) goto LAB_001cdd0c;
  }
  else {
    if (local_390 < 0x2a) {
      if ((local_390 == 0x28) || (local_390 == 0x29)) {
        pFVar12 = infptr->Fptr;
        __size = pFVar12->maxtilelen << 3;
        goto LAB_001cdcc5;
      }
    }
    else {
      if (local_390 == 0x2a) goto LAB_001cdcb6;
      if (local_390 == 0x52) {
        pFVar12 = infptr->Fptr;
        local_318 = malloc(pFVar12->maxtilelen << 3);
        if ((((*(char *)auVar2 == '\0') && (*(char *)((long)auVar2 + 1) == '\0')) &&
            (*(char *)((long)auVar2 + 2) == '\0')) &&
           (((*(char *)((long)auVar2 + 3) == '\0' && (*(char *)((long)auVar2 + 4) == '\0')) &&
            (*(char *)((long)auVar2 + 5) == '\0')))) {
          cVar1 = *(char *)((long)auVar2 + 6);
          local_398 = pdVar9;
          goto joined_r0x001ce4d1;
        }
        goto LAB_001cdd1e;
      }
    }
LAB_001cdce5:
    if (1 < local_390 - 0xb) {
      ffpmsg("unsupported datatype for uncompressing image");
      *status = 0x19a;
      goto LAB_001cdb8d;
    }
    pFVar12 = infptr->Fptr;
    local_318 = malloc(pFVar12->maxtilelen);
    local_398 = (double *)auVar2;
LAB_001cdd0c:
    if (*(char *)local_398 == '\0') {
      local_39c = 0;
    }
  }
LAB_001cdd1e:
  if (local_318 == (void *)0x0) {
    ffpmsg("Out of memory (fits_read_compress_img)");
    *status = 0x71;
  }
  else {
    lVar10 = 0;
    do {
      naxis[lVar10] = 1;
      naxis[lVar10 + 1] = 1;
      tilesize[lVar10] = 1;
      tilesize[lVar10 + 1] = 1;
      ftile[lVar10] = 1;
      ftile[lVar10 + 1] = 1;
      ltile[lVar10] = 1;
      ltile[lVar10 + 1] = 1;
      rowdim[lVar10] = 1;
      rowdim[lVar10 + 1] = 1;
      lVar10 = lVar10 + 2;
    } while (lVar10 != 6);
    iVar3 = pFVar12->zndim;
    if (0 < (long)iVar3) {
      lVar10 = 1;
      lVar7 = 0;
      do {
        lVar4 = *(long *)((long)fpixel + lVar7);
        lVar5 = *(long *)((long)lpixel + lVar7);
        lVar11 = lVar5;
        if (lVar4 < lVar5) {
          lVar11 = lVar4;
        }
        lVar6 = *(long *)((long)pFVar12->znaxis + lVar7);
        *(long *)((long)naxis + lVar7) = lVar6;
        if (lVar11 < 1) {
          free(local_318);
          *status = 0x141;
          goto LAB_001cdb8d;
        }
        if (lVar5 < lVar4) {
          lVar5 = lVar4;
        }
        lVar4 = *(long *)((long)pFVar12->tilesize + lVar7);
        *(long *)((long)tilesize + lVar7) = lVar4;
        lVar6 = (lVar6 + -1) / lVar4 + 1;
        *(long *)((long)ftile + lVar7) = (lVar11 + -1) / lVar4 + 1;
        lVar4 = (lVar5 + -1) / lVar4 + 1;
        if (lVar6 <= lVar4) {
          lVar4 = lVar6;
        }
        *(long *)((long)ltile + lVar7) = lVar4;
        *(long *)((long)rowdim + lVar7) = lVar10;
        lVar10 = lVar10 * lVar6;
        lVar7 = lVar7 + 8;
      } while ((long)iVar3 * 8 != lVar7);
    }
    local_2e8 = ltile[5];
    local_200 = infptr;
    if (ftile[5] <= ltile[5]) {
      local_36c = (int)rowdim[5];
      local_364 = (int)rowdim[4];
      local_35c = (int)rowdim[3];
      local_354 = (int)rowdim[2];
      local_228 = ltile[0];
      local_248 = (ltile[0] - ftile[0]) + 1;
      local_34c = (int)rowdim[1];
      iVar3 = ((int)ftile[2] + -1) * (int)rowdim[2] + ((int)ftile[3] + -1) * (int)rowdim[3] +
              ((int)ftile[4] + -1) * (int)rowdim[4] + ((int)ftile[5] + -1) * (int)rowdim[5] +
              ((int)ftile[1] + -1) * (int)rowdim[1] + (int)ftile[0];
      local_250 = ftile[0] * tilesize[0];
      local_220 = ftile[0];
      local_208 = tilesize[0];
      local_258 = (ftile[0] + -1) * tilesize[0];
      local_260 = -local_258;
      local_258 = local_258 + 1;
      local_2f8 = tilesize[5];
      local_300 = naxis[5];
      local_340 = ltile[4];
      local_2c8 = tilesize[4];
      local_2d0 = naxis[4];
      local_338 = ltile[3];
      local_2a0 = tilesize[3];
      local_2a8 = naxis[3];
      local_330 = ltile[2];
      local_278 = tilesize[2];
      local_280 = naxis[2];
      local_328 = ltile[1];
      local_230 = tilesize[1];
      local_210 = naxis[0];
      local_238 = naxis[1];
      lVar10 = 1;
      local_2f0 = ftile[4];
      local_2c0 = ftile[3];
      local_298 = ftile[2];
      local_270 = ftile[1];
      do {
        lVar7 = (ftile[5] + -1) * local_2f8;
        tlpixel[5] = ftile[5] * local_2f8;
        if (local_300 <= ftile[5] * local_2f8) {
          tlpixel[5] = local_300;
        }
        tfpixel[5] = lVar7 + 1;
        local_368 = iVar3;
        local_2e0 = ftile[5];
        if (local_2f0 <= local_340) {
          local_2d8 = tlpixel[5] - lVar7;
          lVar7 = local_2f0;
          do {
            lVar4 = (lVar7 + -1) * local_2c8;
            tlpixel[4] = lVar7 * local_2c8;
            if (local_2d0 <= lVar7 * local_2c8) {
              tlpixel[4] = local_2d0;
            }
            tfpixel[4] = lVar4 + 1;
            local_360 = iVar3;
            local_2b8 = lVar7;
            if (ftile[3] <= local_338) {
              local_2b0 = (tlpixel[4] - lVar4) * local_2d8;
              do {
                lVar7 = (ftile[3] + -1) * local_2a0;
                tlpixel[3] = ftile[3] * local_2a0;
                if (local_2a8 <= ftile[3] * local_2a0) {
                  tlpixel[3] = local_2a8;
                }
                tfpixel[3] = lVar7 + 1;
                local_358 = iVar3;
                local_290 = ftile[3];
                if (ftile[2] <= local_330) {
                  local_288 = (tlpixel[3] - lVar7) * local_2b0;
                  do {
                    lVar7 = (ftile[2] + -1) * local_278;
                    tlpixel[2] = ftile[2] * local_278;
                    if (local_280 <= ftile[2] * local_278) {
                      tlpixel[2] = local_280;
                    }
                    tfpixel[2] = lVar7 + 1;
                    local_350 = iVar3;
                    local_268 = ftile[2];
                    if (ftile[1] <= local_328) {
                      local_240 = (tlpixel[2] - lVar7) * local_288;
                      do {
                        lVar7 = (ftile[1] + -1) * local_230;
                        tlpixel[1] = ftile[1] * local_230;
                        if (local_238 <= ftile[1] * local_230) {
                          tlpixel[1] = local_238;
                        }
                        tfpixel[1] = lVar7 + 1;
                        local_348 = iVar3;
                        local_218 = ftile[1];
                        if (local_220 <= local_228) {
                          local_1f8 = (tlpixel[1] - lVar7) * local_240;
                          lVar7 = local_248;
                          lVar4 = local_260;
                          lVar5 = local_258;
                          lVar11 = local_250;
                          do {
                            array = local_318;
                            tlpixel[0] = lVar11;
                            if (local_210 < lVar11) {
                              tlpixel[0] = local_210;
                            }
                            lVar6 = (tlpixel[0] + lVar4) * local_1f8;
                            local_310 = lVar10;
                            local_308 = lVar7;
                            local_1f0 = lVar5;
                            tfpixel[0] = lVar5;
                            imcomp_decompress_tile
                                      (local_200,iVar3,(int)lVar6,local_390,local_39c,
                                       (void *)local_380,local_318,(char *)0x0,&local_344,status);
                            lVar10 = local_310;
                            if (local_344 == 0) {
                              ffpss(local_320,local_390,tfpixel,tlpixel,array,status);
                              lVar10 = local_310;
                            }
                            else {
                              ffppn(local_320,local_390,local_310,lVar6,array,(void *)local_380,
                                    status);
                            }
                            lVar10 = lVar10 + lVar6;
                            iVar3 = iVar3 + 1;
                            lVar11 = lVar11 + local_208;
                            lVar4 = lVar4 - local_208;
                            lVar5 = local_1f0 + local_208;
                            lVar7 = local_308 + -1;
                          } while (lVar7 != 0);
                        }
                        ftile[1] = local_218 + 1;
                        iVar3 = local_348 + local_34c;
                      } while (local_218 != local_328);
                    }
                    ftile[2] = local_268 + 1;
                    iVar3 = local_350 + local_354;
                    ftile[1] = local_270;
                  } while (local_268 != local_330);
                }
                ftile[3] = local_290 + 1;
                iVar3 = local_358 + local_35c;
                ftile[2] = local_298;
              } while (local_290 != local_338);
            }
            lVar7 = local_2b8 + 1;
            iVar3 = local_360 + local_364;
            ftile[3] = local_2c0;
          } while (local_2b8 != local_340);
        }
        ftile[5] = local_2e0 + 1;
        iVar3 = local_368 + local_36c;
      } while (local_2e0 != local_2e8);
    }
    free(local_318);
  }
LAB_001cdb8d:
  return *status;
}

Assistant:

int fits_img_decompress (fitsfile *infptr, /* image (bintable) to uncompress */
              fitsfile *outfptr,   /* empty HDU for output uncompressed image */
              int *status)         /* IO - error status               */

/* 
  This routine decompresses the whole image and writes it to the output file.
*/

{
    int ii, datatype = 0;
    int nullcheck, anynul;
    LONGLONG fpixel[MAX_COMPRESS_DIM], lpixel[MAX_COMPRESS_DIM];
    long inc[MAX_COMPRESS_DIM];
    long imgsize;
    float *nulladdr, fnulval;
    double dnulval;

    if (fits_img_decompress_header(infptr, outfptr, status) > 0)
    {
    	return (*status);
    }

    /* force a rescan of the output header keywords, then reset the scaling */
    /* in case the BSCALE and BZERO keywords are present, so that the       */
    /* decompressed values won't be scaled when written to the output image */
    ffrdef(outfptr, status);
    ffpscl(outfptr, 1.0, 0.0, status);
    ffpscl(infptr, 1.0, 0.0, status);

    /* initialize; no null checking is needed for integer images */
    nullcheck = 0;
    nulladdr =  &fnulval;

    /* determine datatype for image */
    if ((infptr->Fptr)->zbitpix == BYTE_IMG)
    {
        datatype = TBYTE;
    }
    else if ((infptr->Fptr)->zbitpix == SHORT_IMG)
    {
        datatype = TSHORT;
    }
    else if ((infptr->Fptr)->zbitpix == LONG_IMG)
    {
        datatype = TINT;
    }
    else if ((infptr->Fptr)->zbitpix == FLOAT_IMG)
    {
        /* In the case of float images we must check for NaNs  */
        nullcheck = 1;
        fnulval = FLOATNULLVALUE;
        nulladdr =  &fnulval;
        datatype = TFLOAT;
    }
    else if ((infptr->Fptr)->zbitpix == DOUBLE_IMG)
    {
        /* In the case of double images we must check for NaNs  */
        nullcheck = 1;
        dnulval = DOUBLENULLVALUE;
        nulladdr = (float *) &dnulval;
        datatype = TDOUBLE;
    }

    /* calculate size of the image (in pixels) */
    imgsize = 1;
    for (ii = 0; ii < (infptr->Fptr)->zndim; ii++)
    {
        imgsize *= (infptr->Fptr)->znaxis[ii];
        fpixel[ii] = 1;              /* Set first and last pixel to */
        lpixel[ii] = (infptr->Fptr)->znaxis[ii]; /* include the entire image. */
        inc[ii] = 1;
    }

    /* uncompress the input image and write to output image, one tile at a time */

    fits_read_write_compressed_img(infptr, datatype, fpixel, lpixel, inc,  
            nullcheck, nulladdr, &anynul, outfptr, status);

    return (*status);
}